

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

LazyObject * __thiscall Assimp::STEP::DB::MustGetObject(DB *this,uint64_t id)

{
  TypeError *this_00;
  allocator<char> local_41;
  string local_40;
  LazyObject *local_20;
  LazyObject *o;
  uint64_t id_local;
  DB *this_local;
  
  o = (LazyObject *)id;
  id_local = (uint64_t)this;
  local_20 = GetObject(this,id);
  if (local_20 == (LazyObject *)0x0) {
    this_00 = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"requested entity is not present",&local_41);
    TypeError::TypeError(this_00,&local_40,(uint64_t)o,0xffffffffffffffff);
    __cxa_throw(this_00,&TypeError::typeinfo,TypeError::~TypeError);
  }
  return local_20;
}

Assistant:

const LazyObject& MustGetObject(uint64_t id) const {
            const LazyObject* o = GetObject(id);
            if (!o) {
                throw TypeError("requested entity is not present",id);
            }
            return *o;
        }